

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PhysBCFunct.H
# Opt level: O2

void __thiscall
amrex::GpuBndryFuncFab<PeleLMFaceFillExtDir>::nddoit
          (GpuBndryFuncFab<PeleLMFaceFillExtDir> *this,Box *bx,FArrayBox *dest,int dcomp,int numcomp
          ,Geometry *geom,Real time,Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcr,
          int bcomp,int orig_comp)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  double *pdVar6;
  undefined8 uVar7;
  bool bVar8;
  byte bVar9;
  int idim;
  long lVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  GeometryData *pGVar21;
  int iVar22;
  GeometryData *pGVar23;
  byte bVar24;
  IntVect IVar25;
  Box local_1fc;
  ulong local_1e0;
  ulong local_1d8;
  ulong local_1d0;
  int local_1c8 [3];
  Box bndry;
  AsyncArray<amrex::BCRec,_0> bcr_aa;
  GeometryData geomdata;
  anon_class_224_9_597d82ad local_110;
  
  bVar24 = 0;
  IVar25 = Box::length(bx);
  local_1c8[0] = IVar25.vect[0];
  local_1c8[1] = IVar25.vect[1];
  local_1c8[2] = IVar25.vect[2];
  local_1fc.smallend.vect[0] = (geom->domain).smallend.vect[0];
  local_1d0 = (ulong)(uint)local_1fc.smallend.vect[0];
  iVar19 = (geom->domain).smallend.vect[1];
  uVar2 = (geom->domain).smallend.vect[2];
  uVar3 = (geom->domain).btype.itype;
  iVar18 = (~uVar3 & 1) + (geom->domain).bigend.vect[0];
  iVar14 = (geom->domain).bigend.vect[1] + (uint)((uVar3 & 2) == 0);
  iVar15 = (geom->domain).bigend.vect[2] + (uint)((uVar3 & 4) == 0);
  local_1fc.smallend.vect[1] = iVar19;
  local_1fc.smallend.vect[2] = uVar2;
  local_1fc.bigend.vect[0] = iVar18;
  local_1fc.bigend.vect[1] = iVar14;
  local_1fc.bigend.vect[2] = iVar15;
  local_1fc.btype.itype = 7;
  for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
    if (*(char *)((long)(geom->super_CoordSys).inv_dx + lVar10 + 0x19) == '\x01') {
      iVar4 = local_1c8[lVar10];
      piVar1 = local_1fc.smallend.vect + lVar10;
      *piVar1 = *piVar1 - iVar4;
      piVar1 = local_1fc.bigend.vect + lVar10;
      *piVar1 = *piVar1 + iVar4;
    }
  }
  bVar8 = Box::contains(&local_1fc,bx);
  if (!bVar8) {
    pdVar6 = (dest->super_BaseFab<double>).dptr;
    iVar4 = (dest->super_BaseFab<double>).nvar;
    uVar3 = (dest->super_BaseFab<double>).domain.smallend.vect[0];
    local_1d8 = (ulong)uVar3;
    iVar5 = (dest->super_BaseFab<double>).domain.smallend.vect[2];
    lVar10 = (long)(dest->super_BaseFab<double>).domain.smallend.vect[1];
    lVar16 = (long)(dest->super_BaseFab<double>).domain.bigend.vect[1] + 1;
    iVar12 = (dest->super_BaseFab<double>).domain.bigend.vect[0];
    lVar20 = (long)(dest->super_BaseFab<double>).domain.bigend.vect[2] + 1;
    lVar13 = ((long)iVar12 - (long)(int)uVar3) + 1;
    lVar17 = (lVar16 - lVar10) * lVar13;
    local_1e0 = (ulong)uVar2;
    Geometry::data(geom);
    Gpu::AsyncArray<amrex::BCRec,_0>::AsyncArray
              (&bcr_aa,(bcr->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
                       super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                       super__Vector_impl_data._M_start + bcomp,(long)numcomp);
    lVar11 = (lVar20 - iVar5) * lVar17;
    lVar10 = (lVar10 << 0x20) + local_1d8;
    lVar16 = (lVar16 << 0x20) + (ulong)(iVar12 + 1);
    bVar9 = (geom->super_CoordSys).field_0x51;
    iVar12 = (int)lVar20;
    if ((bVar9 == 0) && (iVar22 = (int)local_1d0, (bx->smallend).vect[0] < iVar22)) {
      bndry.smallend.vect._0_8_ = *(undefined8 *)(bx->smallend).vect;
      bndry._20_8_ = *(undefined8 *)((bx->bigend).vect + 2);
      bndry.bigend.vect[1] = (int)((ulong)*(undefined8 *)(bx->bigend).vect >> 0x20);
      bndry.smallend.vect[2] = (int)*(undefined8 *)((bx->smallend).vect + 2);
      bndry.bigend.vect[0] = iVar22 + -1;
      local_110.dcomp = dcomp;
      local_110.numcomp = numcomp;
      local_110.fab.p = pdVar6;
      local_110.fab.jstride = lVar13;
      local_110.fab.kstride = lVar17;
      local_110.fab.nstride = lVar11;
      local_110.fab.begin._0_8_ = lVar10;
      local_110.fab.begin.z = iVar5;
      local_110.fab.end._0_8_ = lVar16;
      local_110.fab.end.z = iVar12;
      local_110.fab.ncomp = iVar4;
      local_110.dxhi = iVar22;
      pGVar21 = &geomdata;
      pGVar23 = &local_110.geomdata;
      for (lVar20 = 0xf; lVar20 != 0; lVar20 = lVar20 + -1) {
        (pGVar23->prob_domain).xlo[0] = (pGVar21->prob_domain).xlo[0];
        pGVar21 = (GeometryData *)((long)pGVar21 + (ulong)bVar24 * -0x10 + 8);
        pGVar23 = (GeometryData *)((long)pGVar23 + ((ulong)bVar24 * -2 + 1) * 8);
      }
      local_110.orig_comp = orig_comp;
      local_110.time = time;
      ParallelFor<amrex::GpuBndryFuncFab<PeleLMFaceFillExtDir>::nddoit(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int)::_lambda(int,int,int)_1_>
                (&bndry,(anon_class_224_9_3753836b *)&local_110);
      bVar9 = (geom->super_CoordSys).field_0x51;
    }
    if (((bVar9 & 1) == 0) && (iVar18 < (bx->bigend).vect[0])) {
      uVar7 = *(undefined8 *)(bx->bigend).vect;
      bndry._20_8_ = *(undefined8 *)((bx->bigend).vect + 2);
      bndry.smallend.vect[2] = (int)*(undefined8 *)((bx->smallend).vect + 2);
      bndry.bigend.vect[0] = (int)uVar7;
      bndry.bigend.vect[1] = (int)((ulong)uVar7 >> 0x20);
      bndry.smallend.vect[1] = (int)((ulong)*(undefined8 *)(bx->smallend).vect >> 0x20);
      bndry.smallend.vect[0] = iVar18 + 1;
      local_110.dcomp = dcomp;
      local_110.numcomp = numcomp;
      local_110.fab.p = pdVar6;
      local_110.fab.jstride = lVar13;
      local_110.fab.kstride = lVar17;
      local_110.fab.nstride = lVar11;
      local_110.fab.begin._0_8_ = lVar10;
      local_110.fab.begin.z = iVar5;
      local_110.fab.end._0_8_ = lVar16;
      local_110.fab.end.z = iVar12;
      local_110.fab.ncomp = iVar4;
      local_110.dxhi = iVar18;
      pGVar21 = &geomdata;
      pGVar23 = &local_110.geomdata;
      for (lVar20 = 0xf; lVar20 != 0; lVar20 = lVar20 + -1) {
        (pGVar23->prob_domain).xlo[0] = (pGVar21->prob_domain).xlo[0];
        pGVar21 = (GeometryData *)((long)pGVar21 + (ulong)bVar24 * -0x10 + 8);
        pGVar23 = (GeometryData *)((long)pGVar23 + ((ulong)bVar24 * -2 + 1) * 8);
      }
      local_110.orig_comp = orig_comp;
      local_110.time = time;
      ParallelFor<amrex::GpuBndryFuncFab<PeleLMFaceFillExtDir>::nddoit(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int)::_lambda(int,int,int)_2_>
                (&bndry,&local_110);
    }
    bVar9 = (geom->super_CoordSys).field_0x52;
    if ((bVar9 == 0) && ((bx->smallend).vect[1] < iVar19)) {
      bndry.smallend.vect._0_8_ = *(undefined8 *)(bx->smallend).vect;
      uVar7 = *(undefined8 *)((bx->smallend).vect + 2);
      bndry._20_8_ = *(undefined8 *)((bx->bigend).vect + 2);
      bndry.smallend.vect[2] = (int)uVar7;
      bndry.bigend.vect[0] = (int)((ulong)uVar7 >> 0x20);
      bndry.bigend.vect[1] = iVar19 + -1;
      local_110.dcomp = dcomp;
      local_110.numcomp = numcomp;
      local_110.fab.p = pdVar6;
      local_110.fab.jstride = lVar13;
      local_110.fab.kstride = lVar17;
      local_110.fab.nstride = lVar11;
      local_110.fab.begin._0_8_ = lVar10;
      local_110.fab.begin.z = iVar5;
      local_110.fab.end._0_8_ = lVar16;
      local_110.fab.end.z = iVar12;
      local_110.fab.ncomp = iVar4;
      local_110.dxhi = iVar19;
      pGVar21 = &geomdata;
      pGVar23 = &local_110.geomdata;
      for (lVar20 = 0xf; lVar20 != 0; lVar20 = lVar20 + -1) {
        (pGVar23->prob_domain).xlo[0] = (pGVar21->prob_domain).xlo[0];
        pGVar21 = (GeometryData *)((long)pGVar21 + (ulong)bVar24 * -0x10 + 8);
        pGVar23 = (GeometryData *)((long)pGVar23 + ((ulong)bVar24 * -2 + 1) * 8);
      }
      local_110.orig_comp = orig_comp;
      local_110.time = time;
      ParallelFor<amrex::GpuBndryFuncFab<PeleLMFaceFillExtDir>::nddoit(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int)::_lambda(int,int,int)_3_>
                (&bndry,(anon_class_224_9_9f34b04a *)&local_110);
      bVar9 = (geom->super_CoordSys).field_0x52;
    }
    if (((bVar9 & 1) == 0) && (iVar14 < (bx->bigend).vect[1])) {
      uVar7 = *(undefined8 *)(bx->bigend).vect;
      bndry._20_8_ = *(undefined8 *)((bx->bigend).vect + 2);
      bndry.smallend.vect[2] = (int)*(undefined8 *)((bx->smallend).vect + 2);
      bndry.bigend.vect[0] = (int)uVar7;
      bndry.bigend.vect[1] = (int)((ulong)uVar7 >> 0x20);
      bndry.smallend.vect[0] = (int)*(undefined8 *)(bx->smallend).vect;
      bndry.smallend.vect[1] = iVar14 + 1;
      local_110.dcomp = dcomp;
      local_110.numcomp = numcomp;
      local_110.fab.p = pdVar6;
      local_110.fab.jstride = lVar13;
      local_110.fab.kstride = lVar17;
      local_110.fab.nstride = lVar11;
      local_110.fab.begin._0_8_ = lVar10;
      local_110.fab.begin.z = iVar5;
      local_110.fab.end._0_8_ = lVar16;
      local_110.fab.end.z = iVar12;
      local_110.fab.ncomp = iVar4;
      local_110.dxhi = iVar14;
      pGVar21 = &geomdata;
      pGVar23 = &local_110.geomdata;
      for (lVar20 = 0xf; lVar20 != 0; lVar20 = lVar20 + -1) {
        (pGVar23->prob_domain).xlo[0] = (pGVar21->prob_domain).xlo[0];
        pGVar21 = (GeometryData *)((long)pGVar21 + (ulong)bVar24 * -0x10 + 8);
        pGVar23 = (GeometryData *)((long)pGVar23 + ((ulong)bVar24 * -2 + 1) * 8);
      }
      local_110.orig_comp = orig_comp;
      local_110.time = time;
      ParallelFor<amrex::GpuBndryFuncFab<PeleLMFaceFillExtDir>::nddoit(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int)::_lambda(int,int,int)_4_>
                (&bndry,(anon_class_224_9_c15eaf8c *)&local_110);
    }
    bVar9 = (geom->super_CoordSys).field_0x53;
    if ((bVar9 == 0) && (iVar19 = (int)local_1e0, (bx->smallend).vect[2] < iVar19)) {
      bndry.smallend.vect._0_8_ = *(undefined8 *)(bx->smallend).vect;
      uVar7 = *(undefined8 *)((bx->smallend).vect + 2);
      bndry.bigend.vect[1] = (int)((ulong)*(undefined8 *)(bx->bigend).vect >> 0x20);
      bndry.smallend.vect[2] = (int)uVar7;
      bndry.bigend.vect[0] = (int)((ulong)uVar7 >> 0x20);
      bndry.btype.itype = (uint)((ulong)*(undefined8 *)((bx->bigend).vect + 2) >> 0x20);
      bndry.bigend.vect[2] = iVar19 + -1;
      local_110.dcomp = dcomp;
      local_110.numcomp = numcomp;
      local_110.fab.p = pdVar6;
      local_110.fab.jstride = lVar13;
      local_110.fab.kstride = lVar17;
      local_110.fab.nstride = lVar11;
      local_110.fab.begin._0_8_ = lVar10;
      local_110.fab.begin.z = iVar5;
      local_110.fab.end._0_8_ = lVar16;
      local_110.fab.end.z = iVar12;
      local_110.fab.ncomp = iVar4;
      local_110.dxhi = iVar19;
      pGVar21 = &geomdata;
      pGVar23 = &local_110.geomdata;
      for (lVar20 = 0xf; lVar20 != 0; lVar20 = lVar20 + -1) {
        (pGVar23->prob_domain).xlo[0] = (pGVar21->prob_domain).xlo[0];
        pGVar21 = (GeometryData *)((long)pGVar21 + (ulong)bVar24 * -0x10 + 8);
        pGVar23 = (GeometryData *)((long)pGVar23 + ((ulong)bVar24 * -2 + 1) * 8);
      }
      local_110.orig_comp = orig_comp;
      local_110.time = time;
      ParallelFor<amrex::GpuBndryFuncFab<PeleLMFaceFillExtDir>::nddoit(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int)::_lambda(int,int,int)_5_>
                (&bndry,(anon_class_224_9_0715dd29 *)&local_110);
      bVar9 = (geom->super_CoordSys).field_0x53;
    }
    if (((bVar9 & 1) == 0) && (iVar15 < (bx->bigend).vect[2])) {
      bndry.smallend.vect._0_8_ = *(undefined8 *)(bx->smallend).vect;
      uVar7 = *(undefined8 *)(bx->bigend).vect;
      bndry._20_8_ = *(undefined8 *)((bx->bigend).vect + 2);
      bndry.bigend.vect[0] = (int)uVar7;
      bndry.bigend.vect[1] = (int)((ulong)uVar7 >> 0x20);
      bndry.smallend.vect[2] = iVar15 + 1;
      local_110.dcomp = dcomp;
      local_110.numcomp = numcomp;
      local_110.fab.p = pdVar6;
      local_110.fab.jstride = lVar13;
      local_110.fab.kstride = lVar17;
      local_110.fab.nstride = lVar11;
      local_110.fab.begin._0_8_ = lVar10;
      local_110.fab.begin.z = iVar5;
      local_110.fab.end._0_8_ = lVar16;
      local_110.fab.end.z = iVar12;
      local_110.fab.ncomp = iVar4;
      local_110.dxhi = iVar15;
      pGVar21 = &geomdata;
      pGVar23 = &local_110.geomdata;
      for (lVar10 = 0xf; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pGVar23->prob_domain).xlo[0] = (pGVar21->prob_domain).xlo[0];
        pGVar21 = (GeometryData *)((long)pGVar21 + (ulong)bVar24 * -0x10 + 8);
        pGVar23 = (GeometryData *)((long)pGVar23 + ((ulong)bVar24 * -2 + 1) * 8);
      }
      local_110.orig_comp = orig_comp;
      local_110.time = time;
      ParallelFor<amrex::GpuBndryFuncFab<PeleLMFaceFillExtDir>::nddoit(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int)::_lambda(int,int,int)_6_>
                (&bndry,(anon_class_224_9_293fdc6b *)&local_110);
    }
    Gpu::AsyncArray<amrex::BCRec,_0>::~AsyncArray(&bcr_aa);
  }
  return;
}

Assistant:

void
GpuBndryFuncFab<F>::nddoit (Box const& bx, FArrayBox& dest,
                            const int dcomp, const int numcomp,
                            Geometry const& geom, const Real time,
                            const Vector<BCRec>& bcr, const int bcomp,
                            const int orig_comp)
{
    const IntVect& len = bx.length();

    Box const& domain = amrex::convert(geom.Domain(),IntVect::TheNodeVector());
    Box gdomain = domain;
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        if (geom.isPeriodic(idim)) {
            gdomain.grow(idim,len[idim]);
        }
    }

    if (gdomain.contains(bx)) return;

    Array4<Real> const& fab = dest.array();
    const auto geomdata = geom.data();

    AsyncArray<BCRec> bcr_aa(bcr.data()+bcomp, numcomp);
    BCRec* bcr_p = bcr_aa.data();

    const auto f_user = m_user_f;

    // xlo
    if (!geom.isPeriodic(0) && bx.smallEnd(0) < domain.smallEnd(0)) {
        Box bndry = bx;
        int dxlo = domain.smallEnd(0);
        bndry.setBig(0,dxlo-1);
        amrex::ParallelFor(bndry, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            for (int n = dcomp; n < dcomp+numcomp; ++n) {
                fab(i,j,k,n) = fab(dxlo,j,k,n);
            }
            f_user(IntVect(AMREX_D_DECL(i,j,k)), fab, dcomp, numcomp, geomdata, time,
                   bcr_p, 0, orig_comp);
        });
    }

    // xhi
    if (!geom.isPeriodic(0) && bx.bigEnd(0) > domain.bigEnd(0)) {
        Box bndry = bx;
        int dxhi = domain.bigEnd(0);
        bndry.setSmall(0,dxhi+1);
        amrex::ParallelFor(bndry, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            for (int n = dcomp; n < dcomp+numcomp; ++n) {
                fab(i,j,k,n) = fab(dxhi,j,k,n);
            }
            f_user(IntVect(AMREX_D_DECL(i,j,k)), fab, dcomp, numcomp, geomdata, time,
                   bcr_p, 0, orig_comp);
        });
    }

#if (AMREX_SPACEDIM >= 2)
    // ylo
    if (!geom.isPeriodic(1) && bx.smallEnd(1) < domain.smallEnd(1)) {
        Box bndry = bx;
        int dylo = domain.smallEnd(1);
        bndry.setBig(1,dylo-1);
        amrex::ParallelFor(bndry, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            for (int n = dcomp; n < dcomp+numcomp; ++n) {
                fab(i,j,k,n) = fab(i,dylo,k,n);
            }
            f_user(IntVect(AMREX_D_DECL(i,j,k)), fab, dcomp, numcomp, geomdata, time,
                   bcr_p, 0, orig_comp);
        });
    }

    // yhi
    if (!geom.isPeriodic(1) && bx.bigEnd(1) > domain.bigEnd(1)) {
        Box bndry = bx;
        int dyhi = domain.bigEnd(1);
        bndry.setSmall(1,dyhi+1);
        amrex::ParallelFor(bndry, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            for (int n = dcomp; n < dcomp+numcomp; ++n) {
                fab(i,j,k,n) = fab(i,dyhi,k,n);
            }
            f_user(IntVect(AMREX_D_DECL(i,j,k)), fab, dcomp, numcomp, geomdata, time,
                   bcr_p, 0, orig_comp);
        });
    }
#endif

#if (AMREX_SPACEDIM == 3)
    // zlo
    if (!geom.isPeriodic(2) && bx.smallEnd(2) < domain.smallEnd(2)) {
        Box bndry = bx;
        int dzlo = domain.smallEnd(2);
        bndry.setBig(2,dzlo-1);
        amrex::ParallelFor(bndry, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            for (int n = dcomp; n < dcomp+numcomp; ++n) {
                fab(i,j,k,n) = fab(i,j,dzlo,n);
            }
            f_user(IntVect(AMREX_D_DECL(i,j,k)), fab, dcomp, numcomp, geomdata, time,
                   bcr_p, 0, orig_comp);
        });
    }

    // zhi
    if (!geom.isPeriodic(2) && bx.bigEnd(2) > domain.bigEnd(2)) {
        Box bndry = bx;
        int dzhi = domain.bigEnd(2);
        bndry.setSmall(2,dzhi+1);
        amrex::ParallelFor(bndry, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            for (int n = dcomp; n < dcomp+numcomp; ++n) {
                fab(i,j,k,n) = fab(i,j,dzhi,n);
            }
            f_user(IntVect(AMREX_D_DECL(i,j,k)), fab, dcomp, numcomp, geomdata, time,
                   bcr_p, 0, orig_comp);
        });
    }
#endif
}